

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
atoiTest_testInt64OutOfBoundsLow_Test::~atoiTest_testInt64OutOfBoundsLow_Test
          (atoiTest_testInt64OutOfBoundsLow_Test *this)

{
  atoiTest_testInt64OutOfBoundsLow_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(atoiTest, testInt64OutOfBoundsLow) {
  // out of bounds
  test<int64_t>(false, "-1111111111111111111111111111111111111111111111111111111"); 
  test<int64_t>(false, "-111111111111111111111111111111111111111"); 
  test<int64_t>(false, "-9223372036854775810943"); 
  test<int64_t>(false, "-9223372036854775810"); 
  test<int64_t>(false, "-9223372036854775809"); 
}